

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O0

int Mvc_CoverCheckSuppContainment(Mvc_Cover_t *pCover1,Mvc_Cover_t *pCover2)

{
  bool local_21;
  uint local_20;
  uint local_1c;
  int _i_;
  int Result;
  Mvc_Cover_t *pCover2_local;
  Mvc_Cover_t *pCover1_local;
  
  if (pCover1->nBits != pCover2->nBits) {
    __assert_fail("pCover1->nBits == pCover2->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/mvc/mvcUtils.c"
                  ,0xfa,"int Mvc_CoverCheckSuppContainment(Mvc_Cover_t *, Mvc_Cover_t *)");
  }
  Mvc_CoverAllocateMask(pCover1);
  Mvc_CoverSupport(pCover1,pCover1->pMask);
  Mvc_CoverAllocateMask(pCover2);
  Mvc_CoverSupport(pCover2,pCover2->pMask);
  if ((*(uint *)&pCover2->pMask->field_0x8 & 0xffffff) == 0) {
    local_1c = pCover2->pMask->pData[0] & (pCover1->pMask->pData[0] ^ 0xffffffff);
  }
  else if ((*(uint *)&pCover2->pMask->field_0x8 & 0xffffff) == 1) {
    local_21 = true;
    if ((pCover2->pMask->pData[0] & (pCover1->pMask->pData[0] ^ 0xffffffff)) == 0) {
      local_21 = (*(uint *)&pCover2->pMask->field_0x14 &
                 (*(uint *)&pCover1->pMask->field_0x14 ^ 0xffffffff)) != 0;
    }
    local_1c = (uint)local_21;
  }
  else {
    local_1c = 0;
    for (local_20 = *(uint *)&pCover2->pMask->field_0x8 & 0xffffff; -1 < (int)local_20;
        local_20 = local_20 - 1) {
      if ((pCover2->pMask->pData[(int)local_20] &
          (pCover1->pMask->pData[(int)local_20] ^ 0xffffffff)) != 0) {
        local_1c = 1;
        break;
      }
    }
  }
  return (int)((local_1c != 0 ^ 0xffU) & 1);
}

Assistant:

int Mvc_CoverCheckSuppContainment( Mvc_Cover_t * pCover1, Mvc_Cover_t * pCover2 )
{
    int Result;
    assert( pCover1->nBits == pCover2->nBits );
    // set the supports
    Mvc_CoverAllocateMask( pCover1 );
    Mvc_CoverSupport( pCover1, pCover1->pMask );
    Mvc_CoverAllocateMask( pCover2 );
    Mvc_CoverSupport( pCover2, pCover2->pMask );
    // check the containment
    Mvc_CubeBitNotImpl( Result, pCover2->pMask, pCover1->pMask );
    return !Result;
}